

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DashTests.cpp
# Opt level: O0

void __thiscall
agge::tests::DashTests::ClosedPolygonProducesDashesForTheClosingSegment(DashTests *this)

{
  point pVar1;
  allocator local_261;
  string local_260 [32];
  LocationInfo local_240;
  undefined1 auStack_218 [8];
  point reference [10];
  undefined1 local_f8 [8];
  point result [10];
  undefined1 local_68 [8];
  dash d;
  DashTests *this_local;
  
  d._pattern._limit = (dash_gap *)this;
  dash::dash((dash *)local_68);
  dash::add_dash((dash *)local_68,2.0,1.0);
  move_to<agge::dash>((dash *)local_68,-2.0,2.0);
  line_to<agge::dash>((dash *)local_68,-2.0,-1.0,false);
  line_to<agge::dash>((dash *)local_68,2.0,-1.0,false);
  end_poly<agge::dash>((dash *)local_68,true);
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result[0].x = (real_t)pVar1.command;
  local_f8 = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result[1].x = (real_t)pVar1.command;
  result[0]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result[2].x = (real_t)pVar1.command;
  result[1]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result[3].x = (real_t)pVar1.command;
  result[2]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result[4].x = (real_t)pVar1.command;
  result[3]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result[5].x = (real_t)pVar1.command;
  result[4]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result[6].x = (real_t)pVar1.command;
  result[5]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result[7].x = (real_t)pVar1.command;
  result[6]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result[8].x = (real_t)pVar1.command;
  result[7]._4_8_ = pVar1._0_8_;
  pVar1 = vertex<agge::dash>((dash *)local_68);
  result[9].x = (real_t)pVar1.command;
  result[8]._4_8_ = pVar1._0_8_;
  reference[7].y = -1.2;
  reference[7].command = 0x3fb33333;
  reference[8].x = 2.8026e-45;
  reference[8].y = 0.0;
  reference[6].x = 2.8026e-45;
  reference[6].y = 0.4;
  reference[6].command = 0x3e4ccccd;
  reference[7].x = 1.4013e-45;
  reference[4].command = -0x40800000;
  reference[5].x = 2.8026e-45;
  reference[5].y = 1.2;
  reference[5].command = -0x41333333;
  reference[3].y = 1.0;
  reference[3].command = -0x40800000;
  reference[4].x = 1.4013e-45;
  reference[4].y = 2.0;
  reference[2].x = 1.4013e-45;
  reference[2].y = 0.0;
  reference[2].command = -0x40800000;
  reference[3].x = 2.8026e-45;
  reference[0].command = 0;
  reference[1].x = 2.8026e-45;
  reference[1].y = -2.0;
  reference[1].command = -0x40800000;
  auStack_218._0_4_ = -2.0;
  auStack_218._4_4_ = 2.0;
  reference[0].x = 1.4013e-45;
  reference[0].y = -2.0;
  reference[8].command = 0;
  reference[9].x = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_260,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,&local_261);
  ut::LocationInfo::LocationInfo(&local_240,(string *)local_260,300);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,10ul>
            ((point (*) [10])auStack_218,(point (*) [10])local_f8,&local_240);
  ut::LocationInfo::~LocationInfo(&local_240);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  dash::~dash((dash *)local_68);
  return;
}

Assistant:

test( ClosedPolygonProducesDashesForTheClosingSegment )
			{
				// INIT
				dash d;

				d.add_dash(2.0f, 1.0f);

				// ACT
				move_to(d, -2.0f, 2.0f);
				line_to(d, -2.0f, -1.0f);
				line_to(d, 2.0f, -1.0f);
				end_poly(d, true);

				mocks::path::point result[] = {
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d), vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d),
				};

				// ASSERT
				mocks::path::point reference[] = {
					{ -2.0f, 2.0f, path_command_move_to }, { -2.0f, 0.0f, path_command_line_to },
					{ -2.0f, -1.0f, path_command_move_to }, { 0.0f, -1.0f, path_command_line_to },
					{ 1.0f, -1.0f, path_command_move_to }, { 2.0f, -1.0f, path_command_line_to }, { 1.2f, -0.4f, path_command_line_to },
					{ 0.4f, 0.2f, path_command_move_to }, { -1.2f, 1.4f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference, result);
			}